

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_queue_insert_inserted(event_base *base,event *ev)

{
  int iVar1;
  int local_1c;
  event *ev_local;
  event_base *base_local;
  
  if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar1 = evthread_is_debug_lock_held_(base->th_base_lock), iVar1 == 0)) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xd26,"evthread_is_debug_lock_held_((base)->th_base_lock)",
               "event_queue_insert_inserted");
  }
  if (((ev->ev_evcallback).evcb_flags & 2U) == 0) {
    base->event_count =
         (uint)((((ev->ev_evcallback).evcb_flags & 0x10U) != 0 ^ 0xffU) & 1) + base->event_count;
    if (base->event_count < base->event_count_max) {
      local_1c = base->event_count_max;
    }
    else {
      local_1c = base->event_count;
    }
    base->event_count_max = local_1c;
    (ev->ev_evcallback).evcb_flags = (ev->ev_evcallback).evcb_flags | 2;
    return;
  }
  event_errx(1,"%s: %p(fd %d) already inserted","event_queue_insert_inserted",ev,
             (ulong)(uint)ev->ev_fd);
}

Assistant:

static void
event_queue_insert_inserted(struct event_base *base, struct event *ev)
{
	EVENT_BASE_ASSERT_LOCKED(base);

	if (EVUTIL_FAILURE_CHECK(ev->ev_flags & EVLIST_INSERTED)) {
		event_errx(1, "%s: %p(fd "EV_SOCK_FMT") already inserted", __func__,
		    ev, EV_SOCK_ARG(ev->ev_fd));
		return;
	}

	INCR_EVENT_COUNT(base, ev->ev_flags);

	ev->ev_flags |= EVLIST_INSERTED;
}